

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultEvaluator.cpp
# Opt level: O2

Block * navigate_object_tree(Block *parent,string *target,string *field_name)

{
  long lVar1;
  RuntimeException *this;
  ulong uVar2;
  long lVar3;
  allocator local_f9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  hierarchy;
  is_any_ofF<char> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  hierarchy.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  hierarchy.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  hierarchy.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  boost::algorithm::is_any_of<char[2]>(&local_e0,(char (*) [2])0x132b01);
  boost::algorithm::
  split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string_const&,boost::algorithm::detail::is_any_ofF<char>>
            (&hierarchy,target,&local_e0,token_compress_off);
  boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF(&local_e0);
  uVar2 = 0xffffffffffffffff;
  lVar1 = -0x20;
  do {
    lVar3 = lVar1;
    uVar2 = uVar2 + 1;
    if (((long)hierarchy.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)hierarchy.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U <= uVar2) {
      std::__cxx11::string::_M_assign((string *)field_name);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&hierarchy);
      return parent;
    }
    parent = ninx::parser::element::Block::get_variable
                       (parent,(string *)
                               ((long)&hierarchy.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p
                               + lVar3));
    lVar1 = lVar3 + 0x20;
  } while (parent != (Block *)0x0);
  this = (RuntimeException *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string((string *)&local_48,"TODO",&local_f9);
  std::operator+(&local_c8,"Object \"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&hierarchy.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p + lVar3));
  std::operator+(&local_a8,&local_c8,"\" does not have child \'");
  std::operator+(&local_88,&local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&hierarchy.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p + lVar3));
  std::operator+(&local_68,&local_88,"\'!");
  ninx::evaluator::exception::RuntimeException::RuntimeException(this,0,&local_48,&local_68);
  __cxa_throw(this,&ninx::evaluator::exception::RuntimeException::typeinfo,
              ninx::evaluator::exception::RuntimeException::~RuntimeException);
}

Assistant:

ninx::parser::element::Block * navigate_object_tree(ninx::parser::element::Block * parent, const std::string &target, std::string &field_name) {
    // Resolve the name, navigating the call hierarchy.
    std::vector<std::string> hierarchy;
    boost::split(hierarchy, target, boost::is_any_of("."));
    ninx::parser::element::Block * current_object {parent};
    for (int i = 0; i<hierarchy.size()-1; i++) {
        auto object {current_object->get_variable(hierarchy[i])};

        if (!object) {
            // TODO: add information of line number and origin
            throw ninx::evaluator::exception::RuntimeException(0, "TODO", "Object \""+hierarchy[i]+"\" does not have child '"+hierarchy[i]+"'!");
        }

        current_object = object;
    }

    field_name = hierarchy[hierarchy.size()-1];

    return current_object;
}